

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

char * mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::GetTypeName(void)

{
  int iVar1;
  char *pcVar2;
  allocator<char> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator<char> local_41;
  string local_40 [16];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (CondConId<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>::GetTypeName()::
      nm_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&CondConId<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>::
                                 GetTypeName()::nm_abi_cxx11_);
    if (iVar1 != 0) {
      __rhs = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::type_info::name
                ((type_info *)&AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>::typeinfo);
      std::operator+(in_stack_ffffffffffffffa8,(char *)__rhs);
      std::operator+(in_stack_ffffffffffffffa8,(char *)__rhs);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffe0);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CondConId<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>::GetTypeName()
                    ::nm_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CondConId<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>::
                           GetTypeName()::nm_abi_cxx11_);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

static const char* GetTypeName() {
    static std::string nm =
      std::string("Conditional< ") +
      typeid(Con).name() + " >";
    return nm.c_str();
  }